

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reparser.cpp
# Opt level: O0

bool __thiscall psy::C::Reparser::ambiguityPersists(Reparser *this,SyntaxNode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar3;
  reference ppSVar4;
  value_type ambig;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<const_psy::C::SyntaxNode_*,_std::hash<const_psy::C::SyntaxNode_*>,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::allocator<const_psy::C::SyntaxNode_*>_>
  *__range1;
  SyntaxNode *node_local;
  Reparser *this_local;
  
  iVar2 = (*(node->super_Managed)._vptr_Managed[0xd3])();
  if (((CONCAT44(extraout_var,iVar2) == 0) &&
      (iVar2 = (*(node->super_Managed)._vptr_Managed[0xd5])(), CONCAT44(extraout_var_00,iVar2) == 0)
      ) && (iVar2 = (*(node->super_Managed)._vptr_Managed[0xd1])(),
           CONCAT44(extraout_var_01,iVar2) == 0)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/reparser/Reparser.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x38);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"node isn\'t ambiguous node");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return false;
  }
  bVar1 = std::
          vector<psy::C::Reparser::DisambiguationStrategy,_std::allocator<psy::C::Reparser::DisambiguationStrategy>_>
          ::empty(&this->strategies_);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    __end1 = std::
             unordered_set<const_psy::C::SyntaxNode_*,_std::hash<const_psy::C::SyntaxNode_*>,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::allocator<const_psy::C::SyntaxNode_*>_>
             ::begin(&this->persistentAmbigs_);
    ambig = (value_type)
            std::
            unordered_set<const_psy::C::SyntaxNode_*,_std::hash<const_psy::C::SyntaxNode_*>,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::allocator<const_psy::C::SyntaxNode_*>_>
            ::end(&this->persistentAmbigs_);
    while (bVar1 = std::__detail::operator!=
                             (&__end1.super__Node_iterator_base<const_psy::C::SyntaxNode_*,_false>,
                              (_Node_iterator_base<const_psy::C::SyntaxNode_*,_false> *)&ambig),
          bVar1) {
      ppSVar4 = std::__detail::_Node_const_iterator<const_psy::C::SyntaxNode_*,_true,_false>::
                operator*(&__end1);
      if (node == *ppSVar4) {
        return true;
      }
      std::__detail::_Node_const_iterator<const_psy::C::SyntaxNode_*,_true,_false>::operator++
                (&__end1);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Reparser::ambiguityPersists(const SyntaxNode* node) const
{
    PSY_ASSERT_3(node->asAmbiguousCastOrBinaryExpression()
                        || node->asAmbiguousExpressionOrDeclarationStatement()
                        || node->asAmbiguousTypeNameOrExpressionAsTypeReference(),
                     return false,
                     "node isn't ambiguous node");

    if (strategies_.empty())
        return true;

    for (auto ambig : persistentAmbigs_) {
        if (node == ambig)
            return true;
    }
    return false;
}